

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall
LowererMD::EmitFloatToInt
          (LowererMD *this,Opnd *dst,Opnd *src,Instr *instrInsert,Instr *instrBailOut,
          LabelInstr *labelBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  LabelInstr *labelDone_00;
  LabelInstr *labelHelper_00;
  BailOutInfo *pBVar5;
  Instr *instr_00;
  Instr *instrShare;
  Opnd *arg;
  Instr *instr;
  LabelInstr *labelHelper;
  LabelInstr *labelDone;
  BailOutKind bailOutKind;
  LabelInstr *labelBailOut_local;
  Instr *instrBailOut_local;
  Instr *instrInsert_local;
  Opnd *src_local;
  Opnd *dst_local;
  LowererMD *this_local;
  
  labelDone._4_4_ = BailOutInvalid;
  if ((instrBailOut != (Instr *)0x0) && (bVar2 = IR::Instr::HasBailOutInfo(instrBailOut), bVar2)) {
    labelDone._4_4_ = IR::Instr::GetBailOutKind(instrBailOut);
    BVar3 = IR::operator&(labelDone._4_4_,BailOutOnArrayAccessHelperCall);
    if (BVar3 != BailOutInvalid) {
      if (labelBailOut == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1ce7,"(labelBailOut)","labelBailOut");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      Lowerer::InsertBranch(Br,labelBailOut,instrInsert);
      return;
    }
  }
  labelDone_00 = IR::LabelInstr::New(Label,this->m_func,false);
  labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
  ConvertFloatToInt32(this,dst,src,labelHelper_00,labelDone_00,instrInsert);
  IR::Instr::InsertBefore(instrInsert,&labelHelper_00->super_Instr);
  bVar2 = IR::Opnd::IsFloat32(src);
  instrShare = (Instr *)src;
  if (bVar2) {
    instrShare = (Instr *)IR::RegOpnd::New(TyFloat64,this->m_func);
    EmitFloat32ToFloat64(this,(Opnd *)instrShare,src,instrInsert);
  }
  arg = (Opnd *)IR::Instr::New(CALL,dst,this->m_func);
  IR::Instr::InsertBefore(instrInsert,(Instr *)arg);
  bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(labelDone._4_4_);
  if (bVar2) {
    pBVar5 = IR::Instr::GetBailOutInfo(instrBailOut);
    arg = (Opnd *)IR::Instr::ConvertToBailOutInstr((Instr *)arg,pBVar5,labelDone._4_4_,false);
    pBVar5 = IR::Instr::GetBailOutInfo(instrBailOut);
    if (pBVar5->bailOutInstr == instrBailOut) {
      instr_00 = IR::Instr::ShareBailOut(instrBailOut);
      Lowerer::LowerBailTarget(this->m_lowerer,instr_00);
    }
  }
  LoadDoubleHelperArgument(this,(Instr *)arg,(Opnd *)instrShare);
  ChangeToHelperCall(this,(Instr *)arg,HelperConv_ToInt32Core,(LabelInstr *)0x0,(Opnd *)0x0,
                     (PropertySymOpnd *)0x0,false);
  IR::Instr::InsertBefore(instrInsert,&labelDone_00->super_Instr);
  return;
}

Assistant:

void
LowererMD::EmitFloatToInt(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert, IR::Instr *instrBailOut, IR::LabelInstr * labelBailOut)
{
#ifdef _M_IX86
    // We should only generate this if sse2 is available
    Assert(AutoSystemInfo::Data.SSE2Available());
#endif

    IR::BailOutKind bailOutKind = IR::BailOutInvalid;
    if (instrBailOut && instrBailOut->HasBailOutInfo())
    {
        bailOutKind = instrBailOut->GetBailOutKind();
        if (bailOutKind & IR::BailOutOnArrayAccessHelperCall)
        {
            // Bail out instead of calling helper. If this is happening unconditionally, the caller should instead throw a rejit exception.
            Assert(labelBailOut);
            m_lowerer->InsertBranch(Js::OpCode::Br, labelBailOut, instrInsert);
            return;
        }
    }

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::Instr *instr;

    ConvertFloatToInt32(dst, src, labelHelper, labelDone, instrInsert);

    // $Helper
    instrInsert->InsertBefore(labelHelper);

    IR::Opnd * arg = src;
    if (src->IsFloat32())
    {
        arg = IR::RegOpnd::New(TyFloat64, m_func);

        EmitFloat32ToFloat64(arg, src, instrInsert);
    }

    instr = IR::Instr::New(Js::OpCode::CALL, dst, this->m_func);
    instrInsert->InsertBefore(instr);

    if (BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
    {
        _Analysis_assume_(instrBailOut != nullptr);

        instr = instr->ConvertToBailOutInstr(instrBailOut->GetBailOutInfo(), bailOutKind);
        if (instrBailOut->GetBailOutInfo()->bailOutInstr == instrBailOut)
        {
            IR::Instr * instrShare = instrBailOut->ShareBailOut();
            m_lowerer->LowerBailTarget(instrShare);
        }
    }

    // dst = ToInt32Core(src);
    LoadDoubleHelperArgument(instr, arg);

    this->ChangeToHelperCall(instr, IR::HelperConv_ToInt32Core);

    // $Done
    instrInsert->InsertBefore(labelDone);
}